

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.h
# Opt level: O2

void __thiscall verona::Lookup::Lookup(Lookup *this,Node *def)

{
  _Rb_tree_header *p_Var1;
  
  ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)this,
             &def->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>);
  (this->bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->bindings)._M_t._M_impl.super__Rb_tree_header;
  (this->bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->bindings)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->too_many_typeargs = false;
  return;
}

Assistant:

Lookup(Node def) : def(def) {}